

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXCobraConnection.cpp
# Opt level: O2

void __thiscall ix::CobraConnection::~CobraConnection(CobraConnection *this)

{
  _Any_data local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  disconnect(this);
  local_18 = 0;
  uStack_10 = 0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  setEventCallback(this,(EventCallback *)&local_28);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->_messageQueue);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_Json::Value_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_Json::Value_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_cbs)._M_h);
  ::std::_Function_base::~_Function_base(&(this->_eventCallback).super__Function_base);
  Json::FastWriter::~FastWriter(&this->_jsonWriter);
  Json::Value::~Value(&this->_pdu);
  Json::Value::~Value(&this->_body);
  ::std::__cxx11::string::~string((string *)&this->_roleSecret);
  ::std::__cxx11::string::~string((string *)&this->_roleName);
  ::std::unique_ptr<ix::WebSocket,_std::default_delete<ix::WebSocket>_>::~unique_ptr
            (&this->_webSocket);
  return;
}

Assistant:

CobraConnection::~CobraConnection()
    {
        disconnect();
        setEventCallback(nullptr);
    }